

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O0

mraa_result_t mraa_pwm_enable(mraa_pwm_context dev,int enable)

{
  uint uVar1;
  mraa_result_t mVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  ssize_t sVar6;
  char local_6e [2];
  int size;
  char local_68 [2];
  char out [2];
  int enable_f;
  char bu [64];
  int enable_local;
  mraa_pwm_context dev_local;
  
  if (dev == (mraa_pwm_context)0x0) {
    syslog(3,"pwm: enable: context is NULL");
    dev_local._4_4_ = MRAA_ERROR_INVALID_HANDLE;
  }
  else if (((dev == (mraa_pwm_context)0x0) || (dev->advance_func == (mraa_adv_func_t *)0x0)) ||
          (dev->advance_func->pwm_enable_replace == (_func_mraa_result_t_mraa_pwm_context_int *)0x0)
          ) {
    if (((dev == (mraa_pwm_context)0x0) || (dev->advance_func == (mraa_adv_func_t *)0x0)) ||
       ((dev->advance_func->pwm_enable_pre == (_func_mraa_result_t_mraa_pwm_context_int *)0x0 ||
        (mVar2 = (*dev->advance_func->pwm_enable_pre)(dev,enable), mVar2 == MRAA_SUCCESS)))) {
      snprintf(local_68,0x40,"/sys/class/pwm/pwmchip%d/pwm%d/enable",(ulong)(uint)dev->chipid,
               (ulong)(uint)dev->pin);
      size = open(local_68,2);
      if (size == -1) {
        uVar1 = dev->pin;
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        syslog(3,"pwm_enable: pwm%i: Failed to open enable for writing: %s",(ulong)uVar1,pcVar5);
        dev_local._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
      }
      else {
        iVar3 = snprintf(local_6e,2,"%d",(ulong)(uint)enable);
        sVar6 = write(size,local_6e,(long)iVar3);
        if (sVar6 == -1) {
          uVar1 = dev->pin;
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          syslog(3,"pwm_enable: pwm%i: Failed to write to enable: %s",(ulong)uVar1,pcVar5);
          close(size);
          dev_local._4_4_ = MRAA_ERROR_UNSPECIFIED;
        }
        else {
          close(size);
          dev_local._4_4_ = MRAA_SUCCESS;
        }
      }
    }
    else {
      syslog(3,"mraa_pwm_enable (pwm%i): pwm_enable_pre failed, see syslog",(ulong)(uint)dev->pin);
      dev_local._4_4_ = MRAA_ERROR_UNSPECIFIED;
    }
  }
  else {
    dev_local._4_4_ = (*dev->advance_func->pwm_enable_replace)(dev,enable);
  }
  return dev_local._4_4_;
}

Assistant:

mraa_result_t
mraa_pwm_enable(mraa_pwm_context dev, int enable)
{
    if (!dev) {
        syslog(LOG_ERR, "pwm: enable: context is NULL");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, pwm_enable_replace)) {
        return dev->advance_func->pwm_enable_replace(dev, enable);
    }

    if (IS_FUNC_DEFINED(dev, pwm_enable_pre)) {
        if (dev->advance_func->pwm_enable_pre(dev, enable) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "mraa_pwm_enable (pwm%i): pwm_enable_pre failed, see syslog", dev->pin);
            return MRAA_ERROR_UNSPECIFIED;
        }
    }

    char bu[MAX_SIZE];
    snprintf(bu, MAX_SIZE, "/sys/class/pwm/pwmchip%d/pwm%d/enable", dev->chipid, dev->pin);

    int enable_f = open(bu, O_RDWR);

    if (enable_f == -1) {
        syslog(LOG_ERR, "pwm_enable: pwm%i: Failed to open enable for writing: %s", dev->pin, strerror(errno));
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    char out[2];
    int size = snprintf(out, sizeof(out), "%d", enable);
    if (write(enable_f, out, size * sizeof(char)) == -1) {
        syslog(LOG_ERR, "pwm_enable: pwm%i: Failed to write to enable: %s", dev->pin, strerror(errno));
        close(enable_f);
        return MRAA_ERROR_UNSPECIFIED;
    }
    close(enable_f);
    return MRAA_SUCCESS;
}